

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::setActiveWindow(QGraphicsScene *this,QGraphicsWidget *widget)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  QGraphicsScene *pQVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItem *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  double dVar9;
  double local_60;
  QList<QGraphicsItem_*> local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QGraphicsWidget *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QGraphicsScenePrivate::setActivePanelHelper
                (*(QGraphicsScenePrivate **)(this + 8),(QGraphicsItem *)0x0,false);
      return;
    }
  }
  else {
    pQVar6 = &(widget->super_QGraphicsObject).super_QGraphicsItem;
    pQVar5 = (QGraphicsScene *)QGraphicsItem::scene(pQVar6);
    if (pQVar5 == this) {
      pQVar6 = QGraphicsItem::panel(pQVar6);
      QGraphicsScenePrivate::setActivePanelHelper
                (*(QGraphicsScenePrivate **)(this + 8),pQVar6,false);
      if (pQVar6 != (QGraphicsItem *)0x0) {
        pQVar7 = QGraphicsItem::parentItem(pQVar6);
        local_60 = QGraphicsItem::zValue(pQVar6);
        local_58.d.size._0_4_ = 0xaaaaaaaa;
        local_58.d.size._4_4_ = 0xaaaaaaaa;
        local_58.d.d._0_4_ = 0xaaaaaaaa;
        local_58.d.d._4_4_ = 0xaaaaaaaa;
        local_58.d.ptr._0_4_ = 0xaaaaaaaa;
        local_58.d.ptr._4_4_ = 0xaaaaaaaa;
        if (pQVar7 == (QGraphicsItem *)0x0) {
          (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
                    (&local_58,*(long **)(*(long *)(this + 8) + 0x88),1);
        }
        else {
          QGraphicsItem::childItems(&local_58,pQVar7);
        }
        lVar3 = CONCAT44(local_58.d.size._4_4_,(undefined4)local_58.d.size);
        if (lVar3 != 0) {
          lVar2 = CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
          lVar8 = 0;
          do {
            pQVar7 = *(QGraphicsItem **)(lVar2 + lVar8);
            dVar9 = local_60;
            if (((pQVar7 != pQVar6) && (bVar4 = QGraphicsItem::isWindow(pQVar7), bVar4)) &&
               (dVar9 = QGraphicsItem::zValue(pQVar7), dVar9 <= local_60)) {
              dVar9 = local_60;
            }
            local_60 = dVar9;
            lVar8 = lVar8 + 8;
          } while (lVar3 << 3 != lVar8);
        }
        QGraphicsItem::setZValue(pQVar6,local_60 + 0.001);
        piVar1 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),8,0x10);
          }
        }
      }
    }
    else {
      local_58.d.d._0_4_ = 2;
      local_58.d.d._4_4_ = 0;
      local_58.d.ptr._0_4_ = 0;
      local_58.d.ptr._4_4_ = 0;
      local_58.d.size._0_4_ = 0;
      local_58.d.size._4_4_ = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,
                 "QGraphicsScene::setActiveWindow: widget %p must be part of this scene",widget);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setActiveWindow(QGraphicsWidget *widget)
{
    if (widget && widget->scene() != this) {
        qWarning("QGraphicsScene::setActiveWindow: widget %p must be part of this scene",
                 widget);
        return;
    }

    // Activate the widget's panel (all windows are panels).
    QGraphicsItem *panel = widget ? widget->panel() : nullptr;
    setActivePanel(panel);

    // Raise
    if (panel) {
        QGraphicsItem *parent = panel->parentItem();
        // Raise ### inefficient for toplevels

        // Find the highest z value.
        qreal z = panel->zValue();
        const auto siblings = parent ? parent->childItems() : items();
        for (QGraphicsItem *sibling : siblings) {
            if (sibling != panel && sibling->isWindow())
                z = qMax(z, sibling->zValue());
        }

        // This will probably never overflow.
        const qreal litt = qreal(0.001);
        panel->setZValue(z + litt);
    }
}